

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

secp256k1_aggsig_context *
secp256k1_aggsig_context_create
          (secp256k1_context *ctx,secp256k1_pubkey *pubkeys,size_t n_pubkeys,uchar *seed)

{
  secp256k1_aggsig_context *psVar1;
  nonce_progress *__s;
  secp256k1_pubkey *__dest;
  secp256k1_scalar *psVar2;
  
  psVar1 = (secp256k1_aggsig_context *)malloc(0xe8);
  if (psVar1 == (secp256k1_aggsig_context *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  __s = (nonce_progress *)malloc(n_pubkeys * 4);
  if (__s == (nonce_progress *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  psVar1->progress = __s;
  __dest = (secp256k1_pubkey *)malloc(n_pubkeys << 6);
  if (__dest == (secp256k1_pubkey *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  psVar1->pubkeys = __dest;
  psVar2 = (secp256k1_scalar *)malloc(n_pubkeys << 5);
  if (psVar2 == (secp256k1_scalar *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  psVar1->secnonce = psVar2;
  psVar1->n_sigs = n_pubkeys;
  (psVar1->pubnonce_sum).infinity = 1;
  (psVar1->pubnonce_sum).x.n[0] = 0;
  (psVar1->pubnonce_sum).x.n[1] = 0;
  (psVar1->pubnonce_sum).x.n[2] = 0;
  (psVar1->pubnonce_sum).x.n[3] = 0;
  (psVar1->pubnonce_sum).x.n[4] = 0;
  (psVar1->pubnonce_sum).y.n[0] = 0;
  (psVar1->pubnonce_sum).y.n[1] = 0;
  (psVar1->pubnonce_sum).y.n[2] = 0;
  (psVar1->pubnonce_sum).y.n[3] = 0;
  (psVar1->pubnonce_sum).y.n[4] = 0;
  (psVar1->pubnonce_sum).z.n[0] = 0;
  (psVar1->pubnonce_sum).z.n[1] = 0;
  (psVar1->pubnonce_sum).z.n[2] = 0;
  (psVar1->pubnonce_sum).z.n[3] = 0;
  (psVar1->pubnonce_sum).z.n[4] = 0;
  memcpy(__dest,pubkeys,n_pubkeys << 6);
  memset(__s,0,n_pubkeys * 4);
  secp256k1_rfc6979_hmac_sha256_initialize(&psVar1->rng,seed,0x20);
  return psVar1;
}

Assistant:

secp256k1_aggsig_context* secp256k1_aggsig_context_create(const secp256k1_context *ctx, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const unsigned char *seed) {
    secp256k1_aggsig_context* aggctx;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(seed != NULL);

    aggctx = (secp256k1_aggsig_context*)checked_malloc(&ctx->error_callback, sizeof(*aggctx));
    aggctx->progress = (enum nonce_progress*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->progress));
    aggctx->pubkeys = (secp256k1_pubkey*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->pubkeys));
    aggctx->secnonce = (secp256k1_scalar*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->secnonce));
    aggctx->n_sigs = n_pubkeys;
    secp256k1_gej_set_infinity(&aggctx->pubnonce_sum);
    memcpy(aggctx->pubkeys, pubkeys, n_pubkeys * sizeof(*aggctx->pubkeys));
    memset(aggctx->progress, 0, n_pubkeys * sizeof(*aggctx->progress));
    secp256k1_rfc6979_hmac_sha256_initialize(&aggctx->rng, seed, 32);
    return aggctx;
}